

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_safe_cond_assign(mbedtls_mpi *X,mbedtls_mpi *Y,uchar assign)

{
  ushort uVar1;
  int iVar2;
  ulong uVar3;
  ulong assign_00;
  
  iVar2 = mbedtls_mpi_grow(X,(ulong)Y->n);
  if (iVar2 == 0) {
    uVar3 = -(ulong)assign;
    assign_00 = (long)(uVar3 | assign) >> 0x3f;
    uVar1 = (ushort)((long)uVar3 >> 0x3f);
    X->s = X->s & ~uVar1 | Y->s & uVar1;
    mbedtls_mpi_core_cond_assign(X->p,Y->p,(ulong)Y->n,assign_00);
    uVar1 = X->n;
    for (uVar3 = (ulong)Y->n; uVar3 < uVar1; uVar3 = uVar3 + 1) {
      X->p[uVar3] = X->p[uVar3] & ~assign_00;
    }
  }
  return iVar2;
}

Assistant:

__declspec(noinline)
#endif
int mbedtls_mpi_safe_cond_assign(mbedtls_mpi *X,
                                 const mbedtls_mpi *Y,
                                 unsigned char assign)
{
    int ret = 0;
    MPI_VALIDATE_RET(X != NULL);
    MPI_VALIDATE_RET(Y != NULL);

    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, Y->n));

    {
        mbedtls_ct_condition_t do_assign = mbedtls_ct_bool(assign);

        X->s = (int) mbedtls_ct_uint_if(do_assign, Y->s, X->s);

        mbedtls_mpi_core_cond_assign(X->p, Y->p, Y->n, do_assign);

        mbedtls_ct_condition_t do_not_assign = mbedtls_ct_bool_not(do_assign);
        for (size_t i = Y->n; i < X->n; i++) {
            X->p[i] = mbedtls_ct_mpi_uint_if_else_0(do_not_assign, X->p[i]);
        }
    }

cleanup:
    return ret;
}